

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

void __thiscall crnlib::dynamic_string::optimize(dynamic_string *this)

{
  uint32 num;
  char *__dest;
  char *p;
  uint min_buf_size;
  dynamic_string *this_local;
  
  if (this->m_len == 0) {
    clear(this);
  }
  else {
    num = math::next_pow2(this->m_len + 1);
    if (num < this->m_buf_size) {
      __dest = crnlib_new_array<char>(num);
      memcpy(__dest,this->m_pStr,(long)(int)(this->m_len + 1));
      crnlib_delete_array<char>(this->m_pStr);
      this->m_pStr = __dest;
      this->m_buf_size = (uint16)num;
      check(this);
    }
  }
  return;
}

Assistant:

void dynamic_string::optimize()
    {
        if (!m_len)
        {
            clear();
        }
        else
        {
            uint min_buf_size = math::next_pow2((uint)m_len + 1);
            if (m_buf_size > min_buf_size)
            {
                char* p = crnlib_new_array<char>(min_buf_size);
                memcpy(p, m_pStr, m_len + 1);

                crnlib_delete_array(m_pStr);
                m_pStr = p;

                m_buf_size = static_cast<uint16>(min_buf_size);

                check();
            }
        }
    }